

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::Parse3CachedNFA(int iters,char *regexp,StringPiece *text)

{
  Prog *this;
  Regexp *text_00;
  bool bVar1;
  ostream *poVar2;
  StringPiece *local_558;
  LogMessage local_530;
  StringPiece local_3b0;
  int local_39c;
  undefined1 local_398 [4];
  int i;
  StringPiece sp [4];
  LogMessage local_350;
  Prog *local_1d0;
  Prog *prog;
  LogMessage local_1b8;
  StringPiece local_38;
  Regexp *local_28;
  Regexp *re;
  StringPiece *text_local;
  char *regexp_local;
  int iters_local;
  
  re = (Regexp *)text;
  text_local = (StringPiece *)regexp;
  regexp_local._4_4_ = iters;
  StringPiece::StringPiece(&local_38,regexp);
  local_28 = Regexp::Parse(&local_38,LikePerl,(RegexpStatus *)0x0);
  if (local_28 == (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x462);
    poVar2 = LogMessage::stream(&local_1b8);
    std::operator<<(poVar2,"Check failed: re");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b8);
  }
  local_1d0 = Regexp::CompileToProg(local_28,0);
  if (local_1d0 == (Prog *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_350,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x464);
    poVar2 = LogMessage::stream(&local_350);
    std::operator<<(poVar2,"Check failed: prog");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_350);
  }
  local_558 = (StringPiece *)local_398;
  do {
    StringPiece::StringPiece(local_558);
    local_558 = local_558 + 1;
  } while (local_558 != (StringPiece *)&sp[3].length_);
  for (local_39c = 0; text_00 = re, this = local_1d0, local_39c < regexp_local._4_4_;
      local_39c = local_39c + 1) {
    StringPiece::StringPiece(&local_3b0,(char *)0x0);
    bVar1 = Prog::SearchNFA(this,(StringPiece *)text_00,&local_3b0,kAnchored,kFullMatch,
                            (StringPiece *)local_398,4);
    if (!bVar1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_530,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x467);
      poVar2 = LogMessage::stream(&local_530);
      std::operator<<(poVar2,
                      "Check failed: prog->SearchNFA(text, NULL, Prog::kAnchored, Prog::kFullMatch, sp, 4)"
                     );
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_530);
    }
  }
  if (local_1d0 != (Prog *)0x0) {
    Prog::~Prog(local_1d0);
    operator_delete(this);
  }
  Regexp::Decref(local_28);
  return;
}

Assistant:

void Parse3CachedNFA(int iters, const char* regexp, const StringPiece& text) {
  Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
  CHECK(re);
  Prog* prog = re->CompileToProg(0);
  CHECK(prog);
  StringPiece sp[4];  // 4 because sp[0] is whole match.
  for (int i = 0; i < iters; i++) {
    CHECK(prog->SearchNFA(text, NULL, Prog::kAnchored, Prog::kFullMatch, sp, 4));
  }
  delete prog;
  re->Decref();
}